

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

int lookup_hashtable(hash_table_t *table,hash_key_t key,hash_data_t *data)

{
  int iVar1;
  undefined8 *in_RDX;
  hash_entry_t **in_RSI;
  hash_key_t in_RDI;
  int result;
  hash_entry_t *entry;
  undefined8 local_28;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = lookup((hash_table_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                 in_RDI,in_RSI);
  if (iVar1 == -1) {
    iVar1 = -1;
  }
  else {
    *in_RDX = *(undefined8 *)(local_28 + 8);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int lookup_hashtable(hash_table_t *table, hash_key_t key, hash_data_t *data)
{
   hash_entry_t *entry;
   int result;

   result = lookup(table, key, &entry);
   if (result == -1)
      return -1;
   *data = entry->data;
   return 0;
}